

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::updateSettingsFromWindow(GlxContext *this)

{
  int iVar1;
  ostream *poVar2;
  XVisualInfo *visualInfo_00;
  long lVar3;
  long in_RDI;
  XVisualInfo *visualInfo;
  int nbVisuals;
  XVisualInfo tpl;
  XWindowAttributes windowAttributes;
  undefined4 local_d4;
  undefined1 local_d0 [8];
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff44;
  undefined1 local_90 [24];
  undefined8 local_78;
  
  iVar1 = XGetWindowAttributes
                    (*(undefined8 *)(in_RDI + 0x30),*(undefined8 *)(in_RDI + 0x38),local_90);
  if (iVar1 == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to get the window attributes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    uVar4 = *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0xe0);
    visualInfo_00 = (XVisualInfo *)XVisualIDFromVisual(local_78);
    local_d4 = 0;
    lVar3 = XGetVisualInfo(*(undefined8 *)(in_RDI + 0x30),3,local_d0,&local_d4);
    if (lVar3 != 0) {
      updateSettingsFromVisualInfo
                ((GlxContext *)CONCAT44(in_stack_ffffffffffffff44,uVar4),visualInfo_00);
      XFree(lVar3);
    }
  }
  return;
}

Assistant:

void GlxContext::updateSettingsFromWindow()
{
    // Retrieve the attributes of the target window
    XWindowAttributes windowAttributes;
    if (XGetWindowAttributes(m_display, m_window, &windowAttributes) == 0)
    {
        err() << "Failed to get the window attributes" << std::endl;
        return;
    }

    // Get its visuals
    XVisualInfo tpl;
    tpl.screen   = DefaultScreen(m_display);
    tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
    int nbVisuals = 0;
    XVisualInfo* visualInfo = XGetVisualInfo(m_display, VisualIDMask | VisualScreenMask, &tpl, &nbVisuals);

    if (!visualInfo)
        return;

    updateSettingsFromVisualInfo(visualInfo);

    XFree(visualInfo);
}